

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

bool trim(string *s)

{
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90 [2];
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  ulong local_18;
  size_t pos;
  string *s_local;
  
  pos = (size_t)s;
  uVar3 = std::__cxx11::string::find((char)s,0x23);
  sVar1 = pos;
  local_18 = uVar3;
  if (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::size();
    std::__cxx11::string::erase(sVar1,uVar3);
  }
  sVar1 = pos;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
  local_40 = std::__cxx11::string::begin();
  local_48 = std::__cxx11::string::end();
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,trim(std::__cxx11::string&)::__0>
                       (local_40,local_48);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
  local_58 = std::__cxx11::string::erase(sVar1,local_20,local_30);
  sVar1 = pos;
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trim(std::__cxx11::string&)::__1>
            (&local_70,local_78,local_80);
  local_68._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_70);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_60,&local_68);
  local_98._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_90,&local_98);
  std::__cxx11::string::erase(sVar1,local_60,local_90[0]);
  bVar2 = std::__cxx11::string::empty();
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool trim(string& s)
{
	size_t pos;
	pos = s.find('#');
	if (pos != string::npos)
		s.erase(pos, s.size() - pos);

	// remove leading whitespace
	s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
		return !_isspace(ch);
	}));

	// remove trailing whitespace
	s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
		return !_isspace(ch);
	}).base(), s.end());

	return !s.empty();
}